

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_A<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ArgSlot_OneByte outRegisterID;
  Var aValue;
  
  outRegisterID = playout->Arg;
  aValue = GetReg<unsigned_short>(this,playout->Reg);
  SetOut(this,outRegisterID,aValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_A(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetReg(playout->Reg));
    }